

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

uint32_t ClampedAddSubtractHalf_SSE2(uint32_t c0,uint32_t c1,uint32_t c2)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  ushort uVar1;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  undefined1 auVar2 [16];
  __m128i B0;
  __m128i C1;
  __m128i C0;
  __m128i zero;
  undefined1 local_1d8;
  undefined1 uStack_1d7;
  undefined1 uStack_1d6;
  undefined1 uStack_1d5;
  undefined1 local_1b8;
  undefined1 uStack_1b7;
  undefined1 uStack_1b6;
  undefined1 uStack_1b5;
  undefined1 local_198;
  undefined1 uStack_197;
  undefined1 uStack_196;
  undefined1 uStack_195;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 uStack_f6;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  __m128i A5;
  __m128i A4;
  __m128i A3;
  __m128i A2;
  __m128i BgtA;
  __m128i A1;
  __m128i A0;
  __m128i avg;
  
  local_198 = (byte)in_EDI;
  uStack_197 = (byte)((uint)in_EDI >> 8);
  uStack_196 = (byte)((uint)in_EDI >> 0x10);
  uStack_195 = (byte)((uint)in_EDI >> 0x18);
  local_1b8 = (byte)in_ESI;
  uStack_1b7 = (byte)((uint)in_ESI >> 8);
  uStack_1b6 = (byte)((uint)in_ESI >> 0x10);
  uStack_1b5 = (byte)((uint)in_ESI >> 0x18);
  local_1d8 = (byte)in_EDX;
  uStack_1d7 = (byte)((uint)in_EDX >> 8);
  uStack_1d6 = (byte)((uint)in_EDX >> 0x10);
  uStack_1d5 = (byte)((uint)in_EDX >> 0x18);
  uStack_f6 = (ushort)uStack_1b7;
  uStack_f4 = (ushort)uStack_1b6;
  uStack_f2 = (ushort)uStack_1b5;
  uStack_106 = (ushort)uStack_197;
  uStack_104 = (ushort)uStack_196;
  uStack_102 = (ushort)uStack_195;
  uVar1 = (ushort)((ushort)local_1b8 + (ushort)local_198) >> 1;
  uVar3 = (ushort)(uStack_f6 + uStack_106) >> 1;
  uVar4 = (ushort)(uStack_f4 + uStack_104) >> 1;
  uVar5 = (ushort)(uStack_f2 + uStack_102) >> 1;
  A4[1]._3_1_ = 0;
  A4[1]._2_1_ = uStack_1d7;
  A4[1]._5_1_ = 0;
  A4[1]._4_1_ = uStack_1d6;
  A4[1]._7_1_ = 0;
  A4[1]._6_1_ = uStack_1d5;
  BgtA[1]._3_1_ = 0;
  BgtA[1]._2_1_ = uStack_1d7;
  BgtA[1]._5_1_ = 0;
  BgtA[1]._4_1_ = uStack_1d6;
  BgtA[1]._7_1_ = 0;
  BgtA[1]._6_1_ = uStack_1d5;
  auVar2._2_2_ = (uVar3 - A4[1]._2_2_) + (ushort)(uVar3 < BgtA[1]._2_2_);
  auVar2._0_2_ = (uVar1 - local_1d8) + (ushort)(uVar1 < local_1d8);
  auVar2._4_2_ = (uVar4 - A4[1]._4_2_) + (ushort)(uVar4 < BgtA[1]._4_2_);
  auVar2._6_2_ = (uVar5 - A4[1]._6_2_) + (ushort)(uVar5 < BgtA[1]._6_2_);
  auVar2._8_8_ = 0;
  auVar2 = psraw(auVar2,ZEXT416(1));
  local_128 = auVar2._0_2_;
  uStack_126 = auVar2._2_2_;
  uStack_124 = auVar2._4_2_;
  uStack_122 = auVar2._6_2_;
  local_128 = uVar1 + local_128;
  uStack_126 = uVar3 + uStack_126;
  uStack_124 = uVar4 + uStack_124;
  uStack_122 = uVar5 + uStack_122;
  return CONCAT13((0 < uStack_122) * (uStack_122 < 0x100) * (char)uStack_122 - (0xff < uStack_122),
                  CONCAT12((0 < uStack_124) * (uStack_124 < 0x100) * (char)uStack_124 -
                           (0xff < uStack_124),
                           CONCAT11((0 < uStack_126) * (uStack_126 < 0x100) * (char)uStack_126 -
                                    (0xff < uStack_126),
                                    (0 < local_128) * (local_128 < 0x100) * (char)local_128 -
                                    (0xff < local_128))));
}

Assistant:

static WEBP_INLINE uint32_t ClampedAddSubtractHalf_SSE2(uint32_t c0,
                                                        uint32_t c1,
                                                        uint32_t c2) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i C0 = _mm_unpacklo_epi8(_mm_cvtsi32_si128((int)c0), zero);
  const __m128i C1 = _mm_unpacklo_epi8(_mm_cvtsi32_si128((int)c1), zero);
  const __m128i B0 = _mm_unpacklo_epi8(_mm_cvtsi32_si128((int)c2), zero);
  const __m128i avg = _mm_add_epi16(C1, C0);
  const __m128i A0 = _mm_srli_epi16(avg, 1);
  const __m128i A1 = _mm_sub_epi16(A0, B0);
  const __m128i BgtA = _mm_cmpgt_epi16(B0, A0);
  const __m128i A2 = _mm_sub_epi16(A1, BgtA);
  const __m128i A3 = _mm_srai_epi16(A2, 1);
  const __m128i A4 = _mm_add_epi16(A0, A3);
  const __m128i A5 = _mm_packus_epi16(A4, A4);
  return (uint32_t)_mm_cvtsi128_si32(A5);
}